

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O3

bool withinB44ErrorBounds(half (*A) [4],half (*B) [4])

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  uint uVar10;
  undefined1 auVar11 [14];
  int i_1;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  int i;
  uint uVar17;
  int iVar18;
  long lVar19;
  half (*pahVar20) [4];
  ushort uVar21;
  int iVar22;
  half (*pahVar23) [4];
  int j;
  long lVar24;
  int iVar25;
  bool bVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  short sVar32;
  short sVar37;
  short sVar38;
  short sVar40;
  undefined4 uVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  ushort local_128 [24];
  int local_f8 [34];
  unsigned_short A1 [16];
  int d [16];
  undefined1 auVar30 [16];
  ushort uVar31;
  undefined1 auVar35 [16];
  
  bVar2 = true;
  lVar19 = 0;
  pahVar20 = A;
  pahVar23 = B;
  do {
    lVar24 = 0;
    do {
      bVar2 = (bool)(bVar2 & *(float *)(_imath_half_to_float_table +
                                       (ulong)(*pahVar20)[lVar24]._h * 4) ==
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)(*pahVar23)[lVar24]._h * 4));
      lVar24 = lVar24 + 1;
    } while (lVar24 != 4);
    lVar19 = lVar19 + 1;
    pahVar23 = pahVar23 + 1;
    pahVar20 = pahVar20 + 1;
  } while (lVar19 != 4);
  bVar26 = true;
  if (!bVar2) {
    uVar14 = 0;
    do {
      uVar31 = A[uVar14 >> 2 & 0x3fffffff][(uint)uVar14 & 3]._h;
      if ((~uVar31 & 0x7c00) == 0) {
        A1[uVar14 + 0xc] = 0x8000;
      }
      else {
        if ((short)uVar31 < 0) {
          uVar31 = ~uVar31;
        }
        else {
          uVar31 = uVar31 | 0x8000;
        }
        A1[uVar14 + 0xc] = uVar31;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x10);
    lVar19 = 0;
    auVar34 = ZEXT816(0);
    do {
      auVar29 = psubusw(*(undefined1 (*) [16])(A1 + lVar19 + 0xc),auVar34);
      auVar27._0_2_ = auVar29._0_2_ + auVar34._0_2_;
      auVar27._2_2_ = auVar29._2_2_ + auVar34._2_2_;
      auVar27._4_2_ = auVar29._4_2_ + auVar34._4_2_;
      auVar27._6_2_ = auVar29._6_2_ + auVar34._6_2_;
      auVar27._8_2_ = auVar29._8_2_ + auVar34._8_2_;
      auVar27._10_2_ = auVar29._10_2_ + auVar34._10_2_;
      auVar30._12_2_ = auVar29._12_2_ + auVar34._12_2_;
      auVar30._0_12_ = auVar27;
      auVar30._14_2_ = auVar29._14_2_ + auVar34._14_2_;
      lVar19 = lVar19 + 8;
      auVar34 = auVar30;
    } while (lVar19 != 0x10);
    auVar33._4_4_ = auVar30._12_4_;
    auVar33._0_4_ = auVar27._8_4_;
    auVar33._8_4_ = auVar27._8_4_;
    auVar33._12_4_ = auVar30._12_4_;
    auVar34 = psubusw(auVar33,auVar30);
    sVar32 = auVar34._0_2_ + auVar27._0_2_;
    sVar37 = auVar34._2_2_ + auVar27._2_2_;
    sVar38 = auVar34._4_2_ + auVar27._4_2_;
    sVar40 = auVar34._6_2_ + auVar27._6_2_;
    auVar35._0_8_ = CONCAT26(sVar40,CONCAT24(sVar38,CONCAT22(sVar37,sVar32)));
    auVar35._8_2_ = auVar34._8_2_ + auVar27._8_2_;
    auVar35._10_2_ = auVar34._10_2_ + auVar27._10_2_;
    auVar35._12_2_ = auVar34._12_2_ + auVar30._12_2_;
    auVar35._14_2_ = auVar34._14_2_ + auVar30._14_2_;
    uVar39 = (undefined4)((ulong)auVar35._0_8_ >> 0x20);
    auVar34._4_4_ = uVar39;
    auVar34._0_4_ = uVar39;
    auVar34._8_4_ = uVar39;
    auVar34._12_4_ = uVar39;
    auVar34 = psubusw(auVar34,auVar35);
    sVar32 = auVar34._0_2_ + sVar32;
    uVar31 = auVar34._2_2_ + sVar37;
    auVar28._0_8_ =
         CONCAT26(auVar34._6_2_ + sVar40,CONCAT24(auVar34._4_2_ + sVar38,CONCAT22(uVar31,sVar32)));
    auVar28._8_2_ = auVar34._8_2_ + auVar35._8_2_;
    auVar28._10_2_ = auVar34._10_2_ + auVar35._10_2_;
    auVar29._12_2_ = auVar34._12_2_ + auVar35._12_2_;
    auVar29._0_12_ = auVar28;
    auVar29._14_2_ = auVar34._14_2_ + auVar35._14_2_;
    auVar36._2_2_ = 0;
    auVar36._0_2_ = uVar31;
    auVar36._4_4_ = (uint)((ulong)auVar28._0_8_ >> 0x30);
    auVar36._8_4_ = auVar28._8_4_ >> 0x10;
    auVar36._12_4_ = auVar29._12_4_ >> 0x10;
    auVar34 = psubusw(auVar36,auVar29);
    local_128[0] = auVar34._0_2_ + sVar32;
    uVar10 = (uint)local_128[0];
    iVar16 = -1;
    do {
      iVar1 = iVar16 + 1;
      bVar15 = (byte)iVar1;
      uVar12 = iVar16 + 2;
      uVar17 = ~(-1 << (bVar15 & 0x1f));
      lVar19 = 0;
      do {
        uVar14 = *(ulong *)(A1 + lVar19 + 0xc);
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar14;
        auVar7._12_2_ = (short)(uVar14 >> 0x30);
        auVar8._8_2_ = (short)(uVar14 >> 0x20);
        auVar8._0_8_ = uVar14;
        auVar8._10_4_ = auVar7._10_4_;
        auVar11._6_8_ = 0;
        auVar11._0_6_ = auVar8._8_6_;
        auVar9._4_2_ = (short)(uVar14 >> 0x10);
        auVar9._0_4_ = (uint)uVar14;
        auVar9._6_8_ = SUB148(auVar11 << 0x40,6);
        uVar3 = (uVar10 - ((uint)uVar14 & 0xffff)) * 2;
        uVar4 = (uVar10 - auVar9._4_4_) * 2;
        uVar5 = (uVar10 - auVar8._8_4_) * 2;
        uVar6 = (uVar10 - (auVar7._10_4_ >> 0x10)) * 2;
        uVar14 = (ulong)uVar12;
        local_f8[lVar19] = (int)(uVar3 + uVar17 + (uVar3 >> uVar14 & 1)) >> ZEXT416(uVar12);
        local_f8[lVar19 + 1] = (int)(uVar4 + uVar17 + (uVar4 >> uVar14 & 1)) >> ZEXT416(uVar12);
        local_f8[lVar19 + 2] = (int)(uVar5 + uVar17 + (uVar5 >> uVar14 & 1)) >> ZEXT416(uVar12);
        local_f8[lVar19 + 3] = (int)(uVar6 + uVar17 + (uVar6 >> uVar14 & 1)) >> ZEXT416(uVar12);
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      iVar18 = (local_f8[0] - local_f8[4]) + 0x20;
      iVar13 = local_f8[4] - local_f8[8];
      local_f8[0x11] = iVar13 + 0x20;
      local_f8[0x12] = (local_f8[8] - local_f8[0xc]) + 0x20;
      local_f8[0x13] = (local_f8[0] - local_f8[1]) + 0x20;
      local_f8[0x14] = (local_f8[4] - local_f8[5]) + 0x20;
      local_f8[0x15] = (local_f8[8] - local_f8[9]) + 0x20;
      local_f8[0x16] = (local_f8[0xc] - local_f8[0xd]) + 0x20;
      local_f8[0x17] = (local_f8[1] - local_f8[2]) + 0x20;
      local_f8[0x18] = (local_f8[5] - local_f8[6]) + 0x20;
      local_f8[0x19] = (local_f8[9] - local_f8[10]) + 0x20;
      local_f8[0x1a] = (local_f8[0xd] - local_f8[0xe]) + 0x20;
      local_f8[0x1b] = (local_f8[2] - local_f8[3]) + 0x20;
      local_f8[0x1c] = (local_f8[6] - local_f8[7]) + 0x20;
      local_f8[0x1d] = (local_f8[10] - local_f8[0xb]) + 0x20;
      local_f8[0x1e] = (local_f8[0xe] - local_f8[0xf]) + 0x20;
      lVar19 = 1;
      iVar25 = iVar18;
      iVar22 = iVar18;
      do {
        iVar16 = local_f8[lVar19 + 0x10];
        if (iVar16 <= iVar22) {
          iVar22 = iVar16;
        }
        if (iVar16 < iVar25) {
          iVar16 = iVar25;
        }
        iVar25 = iVar16;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xf);
      iVar16 = iVar1;
    } while ((iVar22 < 0) || (0x3f < iVar25));
    local_128[0] = local_128[0] - (short)(local_f8[0] << (bVar15 & 0x1f));
    sVar37 = (short)(-0x20 << (bVar15 & 0x1f));
    sVar32 = local_128[0] + sVar37;
    local_128[4] = (short)(iVar18 << (bVar15 & 0x1f)) + sVar32;
    local_128[1] = (short)(local_f8[0x13] << (bVar15 & 0x1f)) + sVar32;
    local_128[8] = (short)(iVar13 << (bVar15 & 0x1f)) + local_128[4];
    local_128[0xc] =
         (short)((local_f8[8] - local_f8[0xc]) + iVar13 << (bVar15 & 0x1f)) + local_128[4];
    local_128[5] = (short)(local_f8[0x14] << (bVar15 & 0x1f)) + sVar37 + local_128[4];
    local_128[9] = (short)(local_f8[0x15] << (bVar15 & 0x1f)) + sVar37 + local_128[8];
    local_128[0xd] = (short)(local_f8[0x16] << (bVar15 & 0x1f)) + sVar37 + local_128[0xc];
    local_128[2] = (short)(local_f8[0x17] << (bVar15 & 0x1f)) + sVar37 + local_128[1];
    local_128[6] = (short)(local_f8[0x18] << (bVar15 & 0x1f)) + sVar37 + local_128[5];
    local_128[10] = (short)(local_f8[0x19] << (bVar15 & 0x1f)) + sVar37 + local_128[9];
    local_128[0xe] = (short)(local_f8[0x1a] << (bVar15 & 0x1f)) + sVar37 + local_128[0xd];
    local_128[3] = (short)(local_f8[0x1b] << (bVar15 & 0x1f)) + sVar37 + local_128[2];
    local_128[7] = (short)(local_f8[0x1c] << (bVar15 & 0x1f)) + sVar37 + local_128[6];
    local_128[0xb] = (short)(local_f8[0x1d] << (bVar15 & 0x1f)) + sVar37 + local_128[10];
    local_128[0xf] = (short)(local_f8[0x1e] << (bVar15 & 0x1f)) + sVar37 + local_128[0xe];
    uVar14 = 0;
    bVar26 = false;
    do {
      uVar31 = B[uVar14 >> 2 & 0x3fffffff][(uint)uVar14 & 3]._h;
      uVar21 = uVar31 | 0x8000;
      if ((short)uVar31 < 0) {
        uVar21 = ~uVar31;
      }
      if (local_128[uVar14] + 5 < (uint)uVar21) {
        return bVar26;
      }
      if ((int)(uint)uVar21 < (int)(local_128[uVar14] - 5)) {
        return bVar26;
      }
      bVar26 = 0xe < uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x10);
  }
  return bVar26;
}

Assistant:

bool
withinB44ErrorBounds (const half A[4][4], const half B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    unsigned short t[16];

    for (int i = 0; i < 16; ++i)
    {
        unsigned short Abits = A[i / 4][i % 4].bits ();

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    unsigned short tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    unsigned short A1[16];
    const int      bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        unsigned short A1bits = A1[i];
        unsigned short Bbits  = B[i / 4][i % 4].bits ();

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5) return false;
    }

    return true;
}